

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_float_suite::test_linear_decrease(void)

{
  float absolute_tolerance;
  float local_b0;
  value_type_conflict local_ac [3];
  float local_a0;
  value_type_conflict local_9c [3];
  float local_90;
  value_type_conflict local_8c [3];
  float local_80;
  value_type_conflict local_7c [3];
  float local_70;
  value_type_conflict local_6c [3];
  float local_60;
  value_type_conflict local_5c [3];
  float local_50;
  value_type_conflict local_4c [3];
  float local_40;
  value_type_conflict local_3c [3];
  float local_30;
  value_type_conflict local_2c [4];
  undefined1 local_1c [8];
  moment<float> filter;
  close_to<float> tolerance;
  
  absolute_tolerance = std::numeric_limits<float>::min();
  trial::online::detail::close_to<float>::close_to
            ((close_to<float> *)&filter.normalization,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::basic_moment
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,0.125);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,10.0);
  local_2c[2] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_2c[1] = 10.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","10.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x113,"void mean_float_suite::test_linear_decrease()",local_2c + 2,local_2c + 1);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,9.0);
  local_2c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_30 = 9.46667;
  local_3c[1] = filter.normalization;
  local_3c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","9.46667f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x115,"void mean_float_suite::test_linear_decrease()",local_2c,&local_30,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,8.0);
  local_3c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_40 = 8.91124;
  local_4c[1] = filter.normalization;
  local_4c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","8.91124f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x117,"void mean_float_suite::test_linear_decrease()",local_3c,&local_40,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,7.0);
  local_4c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_50 = 8.33392;
  local_5c[1] = filter.normalization;
  local_5c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","8.33392f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x119,"void mean_float_suite::test_linear_decrease()",local_4c,&local_50,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,5.0);
  local_5c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_60 = 7.47835;
  local_6c[1] = filter.normalization;
  local_6c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","7.47835f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x11b,"void mean_float_suite::test_linear_decrease()",local_5c,&local_60,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,6.0);
  local_6c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_70 = 7.1431;
  local_7c[1] = filter.normalization;
  local_7c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","7.1431f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x11d,"void mean_float_suite::test_linear_decrease()",local_6c,&local_70,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,4.0);
  local_7c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_80 = 6.49616;
  local_8c[1] = filter.normalization;
  local_8c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","6.49616f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x11f,"void mean_float_suite::test_linear_decrease()",local_7c,&local_80,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,3.0);
  local_8c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_90 = 5.83037;
  local_9c[1] = filter.normalization;
  local_9c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","5.83037f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x121,"void mean_float_suite::test_linear_decrease()",local_8c,&local_90,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,2.0);
  local_9c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_a0 = 5.14573;
  local_ac[1] = filter.normalization;
  local_ac[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","5.14573f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x123,"void mean_float_suite::test_linear_decrease()",local_9c,&local_a0,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,1.0);
  local_ac[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_b0 = 4.44252;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","4.44252f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x125,"void mean_float_suite::test_linear_decrease()",local_ac,&local_b0,
             (close_to<float>)filter._4_8_);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<float>(1e-5f);
    decay::moment<float> filter(one_over_eight);
    filter.push(10.0f);
    TRIAL_TEST_EQ(filter.mean(), 10.0f);
    filter.push(9.0f);
    TRIAL_TEST_WITH(filter.mean(), 9.46667f, tolerance);
    filter.push(8.0f);
    TRIAL_TEST_WITH(filter.mean(), 8.91124f, tolerance);
    filter.push(7.0f);
    TRIAL_TEST_WITH(filter.mean(), 8.33392f, tolerance);
    filter.push(5.0f);
    TRIAL_TEST_WITH(filter.mean(), 7.47835f, tolerance);
    filter.push(6.0f);
    TRIAL_TEST_WITH(filter.mean(), 7.1431f, tolerance);
    filter.push(4.0f);
    TRIAL_TEST_WITH(filter.mean(), 6.49616f, tolerance);
    filter.push(3.0f);
    TRIAL_TEST_WITH(filter.mean(), 5.83037f, tolerance);
    filter.push(2.0f);
    TRIAL_TEST_WITH(filter.mean(), 5.14573f, tolerance);
    filter.push(1.0f);
    TRIAL_TEST_WITH(filter.mean(), 4.44252f, tolerance);
}